

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void alphamapblend_argb32
               (quint32 *dst,int coverage,QRgba64 srcLinear,quint32 src,QColorTrcLut *colorProfile)

{
  long lVar1;
  QRgba64 srcLinear_00;
  QRgba64 srcLinear_01;
  uint in_ECX;
  int in_ESI;
  uint *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  QRgba64 s64;
  QRgb s;
  QColorTrcLut *in_stack_00000040;
  quint32 src_00;
  int coverage_00;
  quint32 *in_stack_ffffffffffffffd0;
  quint32 *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI != 0) {
    src_00 = (quint32)((ulong)in_RDI >> 0x20);
    if ((in_ESI == 0xff) || (in_R8 == 0)) {
      blend_pixel(in_stack_ffffffffffffffd0,src_00,(int)in_RDI);
    }
    else if (*in_RDI < 0xff000000) {
      blend_pixel(in_stack_ffffffffffffffd0,src_00,(int)in_RDI);
    }
    else if (in_ECX < 0xff000000) {
      blend_pixel((quint32 *)CONCAT44(in_ESI,in_ECX),(quint32)((ulong)in_R8 >> 0x20));
      coverage_00 = (int)((ulong)in_RDI >> 0x20);
      if (in_R8 == 0) {
        local_28 = (quint32 *)QRgba64::fromArgb32(0);
      }
      else {
        local_28 = (quint32 *)QColorTrcLut::toLinear64(in_stack_00000040,srcLinear.rgba._4_4_);
      }
      srcLinear_01.rgba._4_4_ = coverage;
      srcLinear_01.rgba._0_4_ = src;
      grayBlendPixel(local_28,coverage_00,srcLinear_01,(QColorTrcLut *)CONCAT44(in_ESI,in_ECX));
    }
    else {
      srcLinear_00.rgba._4_4_ = coverage;
      srcLinear_00.rgba._0_4_ = src;
      grayBlendPixel(in_stack_ffffffffffffffd0,src_00,srcLinear_00,
                     (QColorTrcLut *)CONCAT44(in_ESI,in_ECX));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void alphamapblend_argb32(quint32 *dst, int coverage, QRgba64 srcLinear, quint32 src, const QColorTrcLut *colorProfile)
{
    if (coverage == 0) {
        // nothing
    } else if (coverage == 255 || !colorProfile) {
        blend_pixel(*dst, src, coverage);
    } else if (*dst < 0xff000000) {
        // Give up and do a naive gray alphablend. Needed to deal with ARGB32 and invalid ARGB32_premultiplied, see QTBUG-60571
        blend_pixel(*dst, src, coverage);
    } else if (src >= 0xff000000) {
        grayBlendPixel(dst, coverage, srcLinear, colorProfile);
    } else {
        // First do naive blend with text-color
        QRgb s = *dst;
        blend_pixel(s, src);
        // Then gamma-corrected blend with glyph shape
        QRgba64 s64 = colorProfile ? colorProfile->toLinear64(s) : QRgba64::fromArgb32(s);
        grayBlendPixel(dst, coverage, s64, colorProfile);
    }
}